

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::internal::AssignDescriptors
               (string *filename,MigrationSchema *schemas,Message **default_instances_,
               uint32 *offsets,MessageFactory *factory,Metadata *file_level_metadata,
               EnumDescriptor **file_level_enum_descriptors,
               ServiceDescriptor **file_level_service_descriptors)

{
  int iVar1;
  DescriptorPool *this;
  FileDescriptor *pFVar2;
  LogMessage *other;
  long lVar3;
  long lVar4;
  LogFinisher local_71;
  Metadata *local_70;
  undefined1 local_68 [24];
  _Alloc_hider local_50;
  Message **local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_70 = file_level_metadata;
  this = DescriptorPool::generated_pool();
  pFVar2 = DescriptorPool::FindFileByName(this,filename);
  if (pFVar2 == (FileDescriptor *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x908);
    other = LogMessage::operator<<((LogMessage *)local_68,"CHECK failed: file != NULL: ");
    LogFinisher::operator=(&local_71,other);
    LogMessage::~LogMessage((LogMessage *)local_68);
  }
  if (factory == (MessageFactory *)0x0) {
    factory = MessageFactory::generated_factory();
  }
  local_68._8_8_ = local_70;
  local_68._16_8_ = file_level_enum_descriptors;
  if (0 < *(int *)(pFVar2 + 0x58)) {
    lVar4 = 0;
    lVar3 = 0;
    local_68._0_8_ = factory;
    local_50._M_p = (pointer)schemas;
    local_48 = default_instances_;
    local_40._M_allocated_capacity = (size_type)offsets;
    do {
      anon_unknown_0::AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema>::
      AssignMessageDescriptor
                ((AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema> *)local_68,
                 (Descriptor *)(*(long *)(pFVar2 + 0x60) + lVar4));
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xa8;
      file_level_enum_descriptors = (EnumDescriptor **)local_68._16_8_;
    } while (lVar3 < *(int *)(pFVar2 + 0x58));
  }
  iVar1 = *(int *)(pFVar2 + 0x68);
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      *file_level_enum_descriptors = (EnumDescriptor *)(*(long *)(pFVar2 + 0x70) + lVar3);
      file_level_enum_descriptors = file_level_enum_descriptors + 1;
      lVar3 = lVar3 + 0x38;
    } while ((long)iVar1 * 0x38 - lVar3 != 0);
  }
  if ((*(char *)(*(long *)(pFVar2 + 0xa0) + 0xa3) == '\x01') &&
     (iVar1 = *(int *)(pFVar2 + 0x78), 0 < (long)iVar1)) {
    lVar3 = 0;
    do {
      *file_level_service_descriptors = (ServiceDescriptor *)(*(long *)(pFVar2 + 0x80) + lVar3);
      file_level_service_descriptors = file_level_service_descriptors + 1;
      lVar3 = lVar3 + 0x30;
    } while ((long)iVar1 * 0x30 != lVar3);
  }
  return;
}

Assistant:

void AssignDescriptors(
    const string& filename, const MigrationSchema* schemas,
    const Message* const* default_instances_, const uint32* offsets,
    MessageFactory* factory,
    // update the following descriptor arrays.
    Metadata* file_level_metadata,
    const EnumDescriptor** file_level_enum_descriptors,
    const ServiceDescriptor** file_level_service_descriptors) {
  const ::google::protobuf::FileDescriptor* file =
      ::google::protobuf::DescriptorPool::generated_pool()->FindFileByName(filename);
  GOOGLE_CHECK(file != NULL);

  if (!factory) factory = MessageFactory::generated_factory();

  AssignDescriptorsHelper<MigrationSchema> helper(factory, file_level_metadata,
                                 file_level_enum_descriptors, schemas,
                                 default_instances_, offsets);

  for (int i = 0; i < file->message_type_count(); i++) {
    helper.AssignMessageDescriptor(file->message_type(i));
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    helper.AssignEnumDescriptor(file->enum_type(i));
  }
  if (file->options().cc_generic_services()) {
    for (int i = 0; i < file->service_count(); i++) {
      file_level_service_descriptors[i] = file->service(i);
    }
  }
}